

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O1

int TIFFFetchStripThing(TIFF *tif,TIFFDirEntry *dir,uint32_t nstrips,uint64_t **lpp)

{
  TIFFReadDirEntryErr err;
  uint uVar1;
  TIFFField *pTVar2;
  uint64_t *d;
  char *pcVar3;
  ulong maxcount;
  uint64_t *data;
  uint64_t *local_40;
  uint64_t **local_38;
  
  maxcount = (ulong)nstrips;
  err = TIFFReadDirEntryLong8ArrayWithLimit(tif,dir,&local_40,maxcount);
  if (err != TIFFReadDirEntryErrOk) {
    pTVar2 = TIFFFieldWithTag(tif,(uint)dir->tdir_tag);
    if (pTVar2 == (TIFFField *)0x0) {
      pcVar3 = "unknown tagname";
    }
    else {
      pcVar3 = pTVar2->field_name;
    }
    TIFFReadDirEntryOutputErr(tif,err,"TIFFFetchStripThing",pcVar3,0);
    return 0;
  }
  if (dir->tdir_count < maxcount) {
    local_38 = lpp;
    pTVar2 = TIFFFieldWithTag(tif,(uint)dir->tdir_tag);
    pcVar3 = getenv("LIBTIFF_STRILE_ARRAY_MAX_RESIZE_COUNT");
    if (pcVar3 == (char *)0x0) {
      uVar1 = 1000000;
    }
    else {
      uVar1 = atoi(pcVar3);
    }
    lpp = local_38;
    if (pTVar2 == (TIFFField *)0x0) {
      pcVar3 = "unknown tagname";
    }
    else {
      pcVar3 = pTVar2->field_name;
    }
    TIFFReadDirEntryOutputErr
              (tif,TIFFReadDirEntryErrCount,"TIFFFetchStripThing",pcVar3,(uint)(nstrips <= uVar1));
    if ((uVar1 < nstrips) ||
       (d = (uint64_t *)_TIFFCheckMalloc(tif,maxcount,8,"for strip array"), d == (uint64_t *)0x0)) {
      _TIFFfreeExt(tif,local_40);
      return 0;
    }
    if (dir->tdir_count != 0) {
      _TIFFmemcpy(d,local_40,(dir->tdir_count & 0xffffffff) << 3);
    }
    _TIFFmemset(d + (dir->tdir_count & 0xffffffff),0,(ulong)(nstrips - (int)dir->tdir_count) << 3);
    _TIFFfreeExt(tif,local_40);
    local_40 = d;
  }
  *lpp = local_40;
  return 1;
}

Assistant:

static int TIFFFetchStripThing(TIFF *tif, TIFFDirEntry *dir, uint32_t nstrips,
                               uint64_t **lpp)
{
    static const char module[] = "TIFFFetchStripThing";
    enum TIFFReadDirEntryErr err;
    uint64_t *data;
    err = TIFFReadDirEntryLong8ArrayWithLimit(tif, dir, &data, nstrips);
    if (err != TIFFReadDirEntryErrOk)
    {
        const TIFFField *fip = TIFFFieldWithTag(tif, dir->tdir_tag);
        TIFFReadDirEntryOutputErr(tif, err, module,
                                  fip ? fip->field_name : "unknown tagname", 0);
        return (0);
    }
    if (dir->tdir_count < (uint64_t)nstrips)
    {
        uint64_t *resizeddata;
        const TIFFField *fip = TIFFFieldWithTag(tif, dir->tdir_tag);
        const char *pszMax = getenv("LIBTIFF_STRILE_ARRAY_MAX_RESIZE_COUNT");
        uint32_t max_nstrips = 1000000;
        if (pszMax)
            max_nstrips = (uint32_t)atoi(pszMax);
        TIFFReadDirEntryOutputErr(tif, TIFFReadDirEntryErrCount, module,
                                  fip ? fip->field_name : "unknown tagname",
                                  (nstrips <= max_nstrips));

        if (nstrips > max_nstrips)
        {
            _TIFFfreeExt(tif, data);
            return (0);
        }

        resizeddata = (uint64_t *)_TIFFCheckMalloc(
            tif, nstrips, sizeof(uint64_t), "for strip array");
        if (resizeddata == 0)
        {
            _TIFFfreeExt(tif, data);
            return (0);
        }
        if (dir->tdir_count)
            _TIFFmemcpy(resizeddata, data,
                        (uint32_t)dir->tdir_count * sizeof(uint64_t));
        _TIFFmemset(resizeddata + (uint32_t)dir->tdir_count, 0,
                    (nstrips - (uint32_t)dir->tdir_count) * sizeof(uint64_t));
        _TIFFfreeExt(tif, data);
        data = resizeddata;
    }
    *lpp = data;
    return (1);
}